

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator-=(ZZ<130UL> *this,ZZ<130UL> *zRight)

{
  ulong uVar1;
  word wVar2;
  WW<130UL> *in_RSI;
  WW<130UL> *in_RDI;
  size_t pos;
  word borrow;
  ulong local_20;
  ulong local_18;
  
  local_18 = 0;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    uVar1 = in_RDI->_words[local_20] - local_18;
    in_RDI->_words[local_20] = uVar1;
    if (-local_18 - 1 < uVar1) {
      wVar2 = WW<130UL>::GetWord(in_RSI,local_20);
      in_RDI->_words[local_20] = in_RDI->_words[local_20] - wVar2;
    }
    else {
      wVar2 = WW<130UL>::GetWord(in_RSI,local_20);
      uVar1 = in_RDI->_words[local_20] - wVar2;
      in_RDI->_words[local_20] = uVar1;
      wVar2 = WW<130UL>::GetWord(in_RSI,local_20);
      local_18 = (ulong)(-wVar2 - 1 < uVar1);
    }
  }
  WW<130UL>::Trim(in_RDI);
  return (ZZ<130UL> *)in_RDI;
}

Assistant:

ZZ& operator-=(const ZZ& zRight)
	{	
		word borrow = 0;
		for (size_t pos = 0; pos < _wcount; pos++)
			if ((_words[pos] -= borrow) > WORD_MAX - borrow) 
				_words[pos] -= zRight.GetWord(pos);
            else 
				borrow = (_words[pos] -= zRight.GetWord(pos)) > 
					WORD_MAX - zRight.GetWord(pos);
		Trim();
		return *this;
	}